

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  Allocator *pAVar3;
  int k;
  int iVar4;
  Layer *pLVar5;
  ulong uVar6;
  int i;
  void *pvVar7;
  int iVar8;
  long lVar9;
  Option *pOVar10;
  long lVar11;
  undefined4 *puVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  undefined4 *puVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  undefined4 *puVar20;
  int k_1;
  int _h;
  ulong uVar21;
  undefined4 *puVar22;
  Deconvolution_x86 *pDVar23;
  int i_00;
  ulong uVar24;
  ParamDict pd_5;
  ParamDict pd;
  ulong local_140;
  ParamDict local_138;
  Mat local_128;
  void *local_d8;
  Deconvolution_x86 *local_d0;
  Mat local_c8;
  ulong local_80;
  int local_74;
  Option *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  long local_48;
  ModelBinFromMatArray local_40;
  
  if ((this->super_Deconvolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Deconvolution).activation_type) {
  case 1:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  case 2:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,*(this->super_Deconvolution).activation_params.data);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  case 3:
    pLVar5 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  case 4:
    pLVar5 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  case 5:
    pLVar5 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  case 6:
    pLVar5 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_00285b93;
  }
  ParamDict::~ParamDict((ParamDict *)&local_128);
  (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
LAB_00285b93:
  this->activation = pLVar5;
  uVar18 = (long)(this->super_Deconvolution).kernel_h * (long)(this->super_Deconvolution).kernel_w;
  uVar1 = (this->super_Deconvolution).num_output;
  iVar17 = (int)uVar18;
  uVar21 = (long)(this->super_Deconvolution).weight_data_size / (long)iVar17;
  uVar21 = (long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) /
           (long)(int)uVar1;
  uVar24 = 1;
  local_140 = 1;
  if (opt->use_packing_layout == true) {
    local_140 = (ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
    uVar24 = (ulong)((uint)((uVar1 & 3) == 0) * 3 + 1);
  }
  _h = (int)uVar21;
  i_00 = (int)uVar24;
  local_d0 = this;
  local_70 = opt;
  local_58 = uVar18;
  if (opt->use_sgemm_convolution == true) {
    pLVar5 = create_layer_cpu(0x4a);
    this->gemm = pLVar5;
    ParamDict::ParamDict(&local_138);
    ParamDict::set(&local_138,2,1);
    ParamDict::set(&local_138,3,0);
    ParamDict::set(&local_138,4,1);
    ParamDict::set(&local_138,5,0);
    ParamDict::set(&local_138,6,1);
    ParamDict::set(&local_138,7,(this->super_Deconvolution).num_output * iVar17);
    ParamDict::set(&local_138,8,0);
    ParamDict::set(&local_138,9,_h);
    ParamDict::set(&local_138,10,-1);
    ParamDict::set(&local_138,0xb,0);
    ParamDict::set(&local_138,0xc,i_00);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_138);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::reshape(&local_c8,&(this->super_Deconvolution).weight_data,iVar17,_h,
                 (this->super_Deconvolution).num_output,(Allocator *)0x0);
    Mat::create(&local_128,(this->super_Deconvolution).num_output * iVar17,_h,4,(Allocator *)0x0);
    pOVar10 = local_70;
    pDVar23 = local_d0;
    if (0 < _h) {
      local_d8 = local_128.data;
      iVar17 = (local_d0->super_Deconvolution).num_output;
      local_80 = uVar21 & 0xffffffff;
      uVar21 = uVar18 & 0xffffffff;
      uVar15 = 0;
      do {
        if (i_00 <= iVar17) {
          puVar22 = (undefined4 *)
                    (CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * uVar15 *
                     (long)local_c8.w + (long)local_c8.data);
          lVar9 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * local_c8.cstep;
          puVar16 = (undefined4 *)
                    ((long)local_128.w *
                     CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) * uVar15 +
                    (long)local_128.data);
          lVar11 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar6 = 0;
              uVar18 = uVar24;
              puVar12 = puVar22;
              puVar20 = puVar22;
              do {
                do {
                  *puVar16 = *puVar12;
                  puVar16 = puVar16 + 1;
                  uVar18 = uVar18 - 1;
                  puVar12 = (undefined4 *)((long)puVar12 + lVar9);
                } while (uVar18 != 0);
                uVar6 = uVar6 + 1;
                puVar12 = puVar20 + 1;
                uVar18 = uVar24;
                puVar20 = puVar12;
              } while (uVar6 != uVar21);
            }
            lVar11 = lVar11 + uVar24;
            puVar22 = (undefined4 *)((long)puVar22 + lVar9 * uVar24);
            uVar18 = local_58;
          } while (lVar11 < (long)((long)iVar17 - (ulong)(i_00 - 1)));
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_80);
    }
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_c8.data = local_128.data;
    local_c8.refcount._0_4_ = local_128.refcount._0_4_;
    local_c8.refcount._4_4_ = local_128.refcount._4_4_;
    local_c8.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_c8.elemsize._4_4_ = local_128.elemsize._4_4_;
    local_c8.elempack = local_128.elempack;
    local_c8.allocator = local_128.allocator;
    local_c8.dims = local_128.dims;
    local_c8.w = local_128.w;
    local_c8.h = local_128.h;
    local_c8.d = local_128.d;
    local_c8.c = local_128.c;
    local_c8.cstep = local_128.cstep;
    pLVar5 = pDVar23->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_c8);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*pDVar23->gemm->_vptr_Layer[4])(pDVar23->gemm,pOVar10);
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_138);
  }
  else {
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    iVar8 = 0;
    Mat::create(&local_128,(this->super_Deconvolution).weight_data.w,4,(Allocator *)0x0);
    iVar14 = (this->super_Deconvolution).num_output;
    iVar4 = iVar14 * _h;
    uVar15 = uVar18 & 0xffffffff;
    if (0 < iVar4) {
      pvVar7 = (this->super_Deconvolution).weight_data.data;
      puVar16 = (undefined4 *)((long)local_128.data + uVar18 * 4 + -4);
      do {
        if (0 < iVar17) {
          uVar6 = 0;
          puVar22 = puVar16;
          do {
            *puVar22 = *(undefined4 *)((long)pvVar7 + uVar6 * 4);
            uVar6 = uVar6 + 1;
            puVar22 = puVar22 + -1;
          } while (uVar15 != uVar6);
        }
        iVar8 = iVar8 + 1;
        pvVar7 = (void *)((long)pvVar7 + uVar18 * 4);
        puVar16 = puVar16 + uVar18;
      } while (iVar8 != iVar4);
    }
    Mat::reshape(&local_c8,&local_128,iVar17,_h,iVar14,(Allocator *)0x0);
    iVar14 = (int)local_140;
    Mat::create(&this->weight_data_tm,iVar17,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar21 & 0xffffffff) / (long)iVar14
                     ),(this->super_Deconvolution).num_output / i_00,
                (ulong)(uint)(iVar14 * i_00 * 4),iVar14 * i_00,(Allocator *)0x0);
    pOVar10 = local_70;
    pDVar23 = local_d0;
    iVar17 = (this->super_Deconvolution).num_output;
    local_60 = (long)iVar17;
    if (i_00 <= iVar17) {
      local_48 = (local_d0->weight_data_tm).cstep * (local_d0->weight_data_tm).elemsize;
      local_50 = (local_d0->weight_data_tm).data;
      local_80 = (long)_h - (ulong)(iVar14 - 1);
      local_60 = local_60 - (ulong)(i_00 - 1);
      local_d8 = (void *)0x0;
      do {
        if (iVar14 <= _h) {
          puVar16 = (undefined4 *)
                    ((((ulong)local_d8 & 0xffffffff) / uVar24) * local_48 + (long)local_50);
          lVar11 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
          puVar22 = (undefined4 *)(lVar11 * (long)local_d8 + (long)local_c8.data);
          lVar9 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
          ;
          lVar13 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar21 = 0;
              puVar12 = puVar22;
              do {
                uVar6 = 0;
                puVar20 = puVar12;
                uVar18 = uVar24;
                puVar19 = puVar12;
                do {
                  do {
                    *puVar16 = *puVar20;
                    puVar16 = puVar16 + 1;
                    uVar18 = uVar18 - 1;
                    puVar20 = (undefined4 *)((long)puVar20 + lVar11);
                  } while (uVar18 != 0);
                  uVar6 = uVar6 + 1;
                  puVar20 = (undefined4 *)((long)puVar19 + lVar9);
                  uVar18 = uVar24;
                  puVar19 = puVar20;
                } while (uVar6 != local_140);
                uVar21 = uVar21 + 1;
                puVar12 = puVar12 + 1;
              } while (uVar21 != uVar15);
            }
            lVar13 = lVar13 + local_140;
            puVar22 = (undefined4 *)((long)puVar22 + lVar9 * local_140);
            uVar18 = local_58;
          } while (lVar13 < (long)local_80);
        }
        local_d8 = (void *)((long)local_d8 + uVar24);
        local_74 = _h;
      } while ((long)local_d8 < local_60);
    }
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    local_68 = uVar24;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (pOVar10->lightmode == true) {
    piVar2 = (pDVar23->super_Deconvolution).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar7 = (pDVar23->super_Deconvolution).weight_data.data;
        pAVar3 = (pDVar23->super_Deconvolution).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (pDVar23->super_Deconvolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&(pDVar23->super_Deconvolution).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(pDVar23->super_Deconvolution).weight_data.elemsize + 4) = 0;
    (pDVar23->super_Deconvolution).weight_data.data = (void *)0x0;
    (pDVar23->super_Deconvolution).weight_data.refcount = (int *)0x0;
    (pDVar23->super_Deconvolution).weight_data.dims = 0;
    (pDVar23->super_Deconvolution).weight_data.w = 0;
    (pDVar23->super_Deconvolution).weight_data.h = 0;
    (pDVar23->super_Deconvolution).weight_data.d = 0;
    (pDVar23->super_Deconvolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}